

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

CSVError * __thiscall
duckdb::CSVErrorHandler::GetFirstError
          (CSVError *__return_storage_ptr__,CSVErrorHandler *this,CSVErrorType error_type)

{
  InternalException *this_00;
  pointer pCVar1;
  allocator local_41;
  string local_40;
  
  ::std::mutex::lock(&this->main_mutex);
  pCVar1 = (this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
           super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (pCVar1 == (this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
                  super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,
                 "CSVErrorHandler::GetFirstError was called without having an appropriate error type"
                 ,&local_41);
      InternalException::InternalException(this_00,&local_40);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (pCVar1->type == error_type) break;
    pCVar1 = pCVar1 + 1;
  }
  CSVError::CSVError(__return_storage_ptr__,pCVar1);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

CSVError CSVErrorHandler::GetFirstError(CSVErrorType error_type) {
	lock_guard<mutex> parallel_lock(main_mutex);
	for (const auto &er : errors) {
		if (er.type == error_type) {
			return er;
		}
	}
	throw InternalException("CSVErrorHandler::GetFirstError was called without having an appropriate error type");
}